

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_int8.h
# Opt level: O1

void ncnn::pack_A_tile_int8(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  size_t sVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  long lVar23;
  long lVar24;
  long local_78;
  
  iVar7 = cpu_support_x86_avx_vnni_int8();
  if (iVar7 != 0) {
    pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar7 = cpu_support_x86_avx_vnni();
  if (iVar7 == 0) {
    iVar7 = cpu_support_x86_avx2();
    if (iVar7 == 0) {
      puVar22 = (undefined1 *)AT->data;
      uVar12 = 0;
      if (3 < max_ii) {
        lVar8 = (long)i;
        lVar24 = lVar8 + 3;
        lVar23 = lVar8 + 2;
        lVar16 = lVar8 + 1;
        uVar14 = 0;
        local_78 = lVar8;
        do {
          lVar17 = (long)A->w;
          sVar1 = A->elemsize;
          pvVar2 = A->data;
          if (max_kk < 2) {
            lVar17 = sVar1 * lVar17;
            lVar19 = (uVar14 + lVar8) * lVar17 + (long)k;
            lVar11 = (uVar14 + lVar8 + 1) * lVar17 + (long)k;
            lVar9 = (uVar14 + lVar8 + 2) * lVar17 + (long)k;
            lVar13 = (lVar8 + uVar14 + 3) * lVar17 + (long)k;
            uVar15 = 0;
          }
          else {
            lVar13 = sVar1 * lVar24 * lVar17;
            lVar3 = lVar13 + k;
            lVar9 = sVar1 * lVar23 * lVar17;
            lVar4 = lVar9 + k;
            lVar11 = sVar1 * lVar16 * lVar17;
            lVar5 = lVar11 + k;
            lVar17 = sVar1 * local_78 * lVar17;
            lVar6 = lVar17 + k;
            lVar18 = 0;
            puVar20 = puVar22;
            do {
              puVar21 = puVar20;
              puVar20 = puVar22 + lVar18 * 4;
              *puVar20 = *(undefined1 *)((long)pvVar2 + lVar18 + lVar6);
              puVar20[1] = *(undefined1 *)((long)pvVar2 + lVar18 + lVar6 + 1);
              puVar20[2] = *(undefined1 *)((long)pvVar2 + lVar18 + lVar5);
              puVar20[3] = *(undefined1 *)((long)pvVar2 + lVar18 + lVar5 + 1);
              puVar20[4] = *(undefined1 *)((long)pvVar2 + lVar18 + lVar4);
              puVar20[5] = *(undefined1 *)((long)pvVar2 + lVar18 + lVar4 + 1);
              puVar20[6] = *(undefined1 *)((long)pvVar2 + lVar18 + lVar3);
              puVar20[7] = *(undefined1 *)((long)pvVar2 + lVar18 + lVar3 + 1);
              lVar19 = lVar18 + 2;
              iVar7 = (int)lVar18;
              lVar18 = lVar19;
              puVar20 = puVar20 + 8;
            } while (iVar7 + 3 < max_kk);
            puVar22 = puVar21 + 8;
            lVar19 = lVar19 + k;
            lVar13 = lVar13 + lVar19;
            lVar9 = lVar9 + lVar19;
            lVar11 = lVar11 + lVar19;
            lVar19 = lVar17 + lVar19;
            uVar15 = max_kk & 0xfffffffe;
          }
          if ((int)uVar15 < max_kk) {
            lVar17 = 0;
            do {
              *puVar22 = *(undefined1 *)((long)pvVar2 + lVar17 + lVar19);
              puVar22[1] = *(undefined1 *)((long)pvVar2 + lVar17 + lVar11);
              puVar22[2] = *(undefined1 *)((long)pvVar2 + lVar17 + lVar9);
              puVar22[3] = *(undefined1 *)((long)pvVar2 + lVar17 + lVar13);
              puVar22 = puVar22 + 4;
              lVar17 = lVar17 + 1;
            } while (max_kk - uVar15 != (int)lVar17);
          }
          uVar12 = uVar14 + 4;
          uVar10 = uVar14 + 7;
          lVar24 = lVar24 + 4;
          lVar23 = lVar23 + 4;
          lVar16 = lVar16 + 4;
          local_78 = local_78 + 4;
          uVar14 = uVar12;
        } while (uVar10 < (uint)max_ii);
      }
      if ((int)((uint)uVar12 | 1) < max_ii) {
        uVar14 = uVar12 & 0xffffffff;
        do {
          lVar24 = (long)A->w * A->elemsize;
          puVar20 = (undefined1 *)((long)A->data + (uVar14 + (long)i) * lVar24 + (long)k);
          puVar21 = (undefined1 *)((long)A->data + (uVar14 + (long)i + 1) * lVar24 + (long)k);
          if (max_kk < 2) {
            uVar15 = 0;
          }
          else {
            iVar7 = 1;
            do {
              *puVar22 = *puVar20;
              puVar22[1] = puVar20[1];
              puVar22[2] = *puVar21;
              puVar22[3] = puVar21[1];
              puVar22 = puVar22 + 4;
              puVar20 = puVar20 + 2;
              puVar21 = puVar21 + 2;
              iVar7 = iVar7 + 2;
              uVar15 = max_kk & 0xfffffffe;
            } while (iVar7 < max_kk);
          }
          if ((int)uVar15 < max_kk) {
            lVar24 = 0;
            do {
              *puVar22 = puVar20[lVar24];
              puVar22[1] = puVar21[lVar24];
              puVar22 = puVar22 + 2;
              lVar24 = lVar24 + 1;
            } while (max_kk - uVar15 != (int)lVar24);
          }
          uVar12 = uVar14 + 2;
          lVar24 = uVar14 + 3;
          uVar14 = uVar12;
        } while (lVar24 < max_ii);
      }
      if ((int)uVar12 < max_ii) {
        uVar12 = uVar12 & 0xffffffff;
        lVar24 = (long)i + uVar12;
        do {
          if (0 < max_kk) {
            iVar7 = A->w;
            pvVar2 = A->data;
            sVar1 = A->elemsize;
            lVar23 = 0;
            do {
              puVar22[lVar23] =
                   *(undefined1 *)((long)pvVar2 + lVar23 + sVar1 * lVar24 * (long)iVar7 + (long)k);
              lVar23 = lVar23 + 1;
            } while (max_kk != (int)lVar23);
            puVar22 = puVar22 + lVar23;
          }
          uVar12 = uVar12 + 1;
          lVar24 = lVar24 + 1;
        } while (uVar12 != (uint)max_ii);
      }
      return;
    }
    pack_A_tile_int8_avx2(A,AT,i,max_ii,k,max_kk);
    return;
  }
  pack_A_tile_int8_avxvnni(A,AT,i,max_ii,k,max_kk);
  return;
}

Assistant:

static void pack_A_tile_int8(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        pack_A_tile_int8_avx512vnni(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNIINT8 && __AVX__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni_int8())
    {
        pack_A_tile_int8_avxvnniint8(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        pack_A_tile_int8_avxvnni(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        pack_A_tile_int8_avx2(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

    // NCNN_LOGE("pack_A_tile_int8");
    // assert A.elempack == 1
    // assert A.dims == 2

    signed char* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX2__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

        __m512i _vindex = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(A.w));

        int kk = 0;
#if __AVX512VNNI__
        __m512i _w_shift = _mm512_setzero_si512();
        __m512i _v127 = _mm512_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m512i _p = _mm512_i32gather_epi32(_vindex, p0, sizeof(signed char));
            _w_shift = _mm512_dpbusd_epi32(_w_shift, _v127, _p);
            _mm512_storeu_si512((__m512i*)pp, _p);
            pp += 64;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            _mm512_storeu_si512((__m512i*)pp, _w_shift);
            pp += 64;
        }
#endif // __AVX512VNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m256i _p = _mm512_cvtepi32_epi16(_mm512_i32gather_epi32(_vindex, p0, sizeof(signed char)));
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm512_cvtepi32_epi8(_mm512_i32gather_epi32(_vindex, p0, sizeof(signed char)));
            _mm_store_si128((__m128i*)pp, _p);
            pp += 16;
            p0++;
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

        __m256i _vindex = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(A.w));

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m256i _p = _mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        __m256i _w_shift = _mm256_setzero_si256();
        __m256i _v127 = _mm256_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m256i _p = _mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _w_shift = _mm256_comp_dpbusd_epi32(_w_shift, _v127, _p);
            _mm256_storeu_si256((__m256i*)pp, _p);
            pp += 32;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            _mm256_storeu_si256((__m256i*)pp, _w_shift);
            pp += 32;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m128i _p = _mm256_comp_cvtepi32_epi16(_mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
#if __AVX512F__
            _mm_store_si128((__m128i*)pp, _p);
#else
            _mm_storeu_si128((__m128i*)pp, _p);
#endif
            pp += 16;
            p0 += 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm256_comp_cvtepi32_epi8(_mm256_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0++;
        }
    }
#endif // __AVX2__
    for (; ii + 3 < max_ii; ii += 4)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(A.w));
#else
        const signed char* p1 = A.row<const signed char>(i + ii + 1) + k;
        const signed char* p2 = A.row<const signed char>(i + ii + 2) + k;
        const signed char* p3 = A.row<const signed char>(i + ii + 3) + k;
#endif // __AVX2__

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _mm_storeu_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        __m128i _w_shift = _mm_setzero_si128();
        __m128i _v127 = _mm_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            _w_shift = _mm_comp_dpbusd_epi32(_w_shift, _v127, _p);
            _mm_storeu_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            _mm_storeu_si128((__m128i*)pp, _w_shift);
            pp += 16;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
#if __AVX2__
            __m128i _p = _mm_comp_cvtepi32_epi16(_mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0 += 2;
#else
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p1[0];
            pp[3] = p1[1];
            pp[4] = p2[0];
            pp[5] = p2[1];
            pp[6] = p3[0];
            pp[7] = p3[1];
            pp += 8;
            p0 += 2;
            p1 += 2;
            p2 += 2;
            p3 += 2;
#endif // __AVX2__
        }
        for (; kk < max_kk; kk++)
        {
#if __AVX2__
            __m128i _p = _mm_comp_cvtepi32_epi8(_mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char)));
            _mm_store_ss((float*)pp, _mm_castsi128_ps(_p));
            pp += 4;
            p0++;
#else
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp[2] = p2[0];
            pp[3] = p3[0];
            pp += 4;
            p0++;
            p1++;
            p2++;
            p3++;
#endif // __AVX2__
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;
        const signed char* p1 = A.row<const signed char>(i + ii + 1) + k;

        int kk = 0;
#if __SSE2__
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp[4] = p1[0];
            pp[5] = p1[1];
            pp[6] = p1[2];
            pp[7] = p1[3];
            pp += 8;
            p0 += 4;
            p1 += 4;
        }
#else  // __AVXVNNIINT8__
        int w_shift0 = 0;
        int w_shift1 = 0;
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp[4] = p1[0];
            pp[5] = p1[1];
            pp[6] = p1[2];
            pp[7] = p1[3];
            w_shift0 += pp[0];
            w_shift0 += pp[1];
            w_shift0 += pp[2];
            w_shift0 += pp[3];
            w_shift1 += pp[4];
            w_shift1 += pp[5];
            w_shift1 += pp[6];
            w_shift1 += pp[7];
            pp += 8;
            p0 += 4;
            p1 += 4;
        }
        if (max_kk >= 4)
        {
            ((int*)pp)[0] = w_shift0 * 127;
            ((int*)pp)[1] = w_shift1 * 127;
            pp += 8;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p1[0];
            pp[3] = p1[1];
            pp += 4;
            p0 += 2;
            p1 += 2;
        }
#endif // __SSE2__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p1[0];
            pp += 2;
            p0++;
            p1++;
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        const signed char* p0 = A.row<const signed char>(i + ii) + k;

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp += 4;
            p0 += 4;
        }
#else  // __AVXVNNIINT8__
        int w_shift = 0;
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            w_shift += pp[0];
            w_shift += pp[1];
            w_shift += pp[2];
            w_shift += pp[3];
            pp += 4;
            p0 += 4;
        }
        if (max_kk >= 4)
        {
            ((int*)pp)[0] = w_shift * 127;
            pp += 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp += 1;
            p0++;
        }
    }
}